

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeFunctionType
          (Builder *this,Id returnType,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes)

{
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  pointer puVar1;
  pointer puVar2;
  Builder *pBVar3;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  Id IVar4;
  int iVar5;
  Id IVar6;
  mapped_type *pmVar7;
  mapped_type_conflict *pmVar8;
  Instruction *pIVar9;
  int p;
  long lVar10;
  long lVar11;
  Instruction *type;
  Id typeId;
  Builder *local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  local_38 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->groupedTypes;
  lVar11 = 0;
  local_60 = this;
  do {
    this_01 = local_38;
    local_58._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x21;
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_38,(key_type *)&local_58);
    pBVar3 = local_60;
    if ((int)((ulong)((long)(pmVar7->
                            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar7->
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar11) {
      IVar4 = local_60->uniqueId + 1;
      local_60->uniqueId = IVar4;
      typeId = IVar4;
      pIVar9 = (Instruction *)::operator_new(0x60);
      pIVar9->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
      pIVar9->resultId = IVar4;
      pIVar9->typeId = 0;
      pIVar9->opCode = OpTypeFunction;
      (pIVar9->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (pIVar9->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (pIVar9->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar9->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar9->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (pIVar9->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pIVar9->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (pIVar9->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      pIVar9->block = (Block *)0x0;
      type = pIVar9;
      Instruction::reserveOperands
                (pIVar9,((long)(paramTypes->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(paramTypes->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2) + 1);
      Instruction::addIdOperand(pIVar9,returnType);
      for (lVar11 = 0;
          puVar1 = (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start,
          lVar11 < (int)((ulong)((long)(paramTypes->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)
                        >> 2); lVar11 = lVar11 + 1) {
        Instruction::addIdOperand(pIVar9,puVar1[lVar11]);
      }
      local_58._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,0x21);
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_01,(key_type *)&local_58);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(pmVar7,&type);
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)type;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&pBVar3->constantsTypesGlobals,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_58);
      if ((Instruction *)local_58._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
        (*(*(_func_int ***)local_58._M_impl.super__Vector_impl_data._M_start)[1])();
      }
      Module::mapInstruction(&pBVar3->module,type);
      if (pBVar3->emitNonSemanticShaderDebugInfo != false) {
        IVar4 = makeDebugFunctionType(pBVar3,returnType,paramTypes);
        pmVar8 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&pBVar3->debugId,&typeId);
        *pmVar8 = IVar4;
      }
      return type->resultId;
    }
    local_58._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,0x21);
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_01,(key_type *)&local_58);
    pIVar9 = (pmVar7->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar11];
    type = pIVar9;
    IVar4 = Instruction::getIdOperand(pIVar9,0);
    if ((IVar4 == returnType) &&
       (puVar1 = (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
       puVar2 = (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start,
       iVar5 = Instruction::getNumOperands(pIVar9),
       iVar5 + -1 == (int)((ulong)((long)puVar1 - (long)puVar2) >> 2))) {
      lVar10 = 0;
      do {
        pBVar3 = local_60;
        puVar1 = (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(paramTypes->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2) <=
            lVar10) {
          if (local_60->emitNonSemanticShaderDebugInfo == true) {
            this_00 = &local_60->debugId;
            local_58._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   pIVar9->resultId);
            pmVar8 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::operator[](this_00,(key_type_conflict *)&local_58);
            if (*pmVar8 == 0) {
              if (pBVar3->sourceLang != SourceLanguageHLSL) {
                __assert_fail("sourceLang == spv::SourceLanguageHLSL",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                              ,0x286,
                              "Id spv::Builder::makeFunctionType(Id, const std::vector<Id> &)");
              }
              if (((pBVar3->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[returnType]->opCode != OpTypeVoid) ||
                 ((paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start)) {
                __assert_fail("getTypeClass(returnType) == OpTypeVoid && paramTypes.size() == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                              ,0x287,
                              "Id spv::Builder::makeFunctionType(Id, const std::vector<Id> &)");
              }
              local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              IVar4 = makeDebugFunctionType
                                (pBVar3,returnType,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&local_58);
              local_58._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     pIVar9->resultId);
              pmVar8 = std::
                       map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       ::operator[](this_00,(key_type_conflict *)&local_58);
              *pmVar8 = IVar4;
            }
          }
          return pIVar9->resultId;
        }
        IVar4 = puVar1[lVar10];
        lVar10 = lVar10 + 1;
        IVar6 = Instruction::getIdOperand(pIVar9,(int)lVar10);
      } while (IVar4 == IVar6);
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

Id Builder::makeFunctionType(Id returnType, const std::vector<Id>& paramTypes)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeFunction].size(); ++t) {
        type = groupedTypes[OpTypeFunction][t];
        if (type->getIdOperand(0) != returnType || (int)paramTypes.size() != type->getNumOperands() - 1)
            continue;
        bool mismatch = false;
        for (int p = 0; p < (int)paramTypes.size(); ++p) {
            if (paramTypes[p] != type->getIdOperand(p + 1)) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch)
        {
            // If compiling HLSL, glslang will create a wrapper function around the entrypoint. Accordingly, a void(void)
            // function type is created for the wrapper function. However, nonsemantic shader debug information is disabled
            // while creating the HLSL wrapper. Consequently, if we encounter another void(void) function, we need to create
            // the associated debug function type if it hasn't been created yet.
            if(emitNonSemanticShaderDebugInfo && debugId[type->getResultId()] == 0) {
                assert(sourceLang == spv::SourceLanguageHLSL);
                assert(getTypeClass(returnType) == OpTypeVoid && paramTypes.size() == 0);

                Id debugTypeId = makeDebugFunctionType(returnType, {});
                debugId[type->getResultId()] = debugTypeId;
            }
            return type->getResultId();
        }
    }

    // not found, make it
    Id typeId = getUniqueId();
    type = new Instruction(typeId, NoType, OpTypeFunction);
    type->reserveOperands(paramTypes.size() + 1);
    type->addIdOperand(returnType);
    for (int p = 0; p < (int)paramTypes.size(); ++p)
        type->addIdOperand(paramTypes[p]);
    groupedTypes[OpTypeFunction].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // make debug type and map it
    if (emitNonSemanticShaderDebugInfo) {
        Id debugTypeId = makeDebugFunctionType(returnType, paramTypes);
        debugId[typeId] = debugTypeId;
    }

    return type->getResultId();
}